

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * util::ToString<double>(string *__return_storage_ptr__,double *t)

{
  long in_FS_OFFSET;
  ostringstream oss;
  locale local_1a0 [8];
  ostringstream local_198 [376];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::ostream::_M_insert<double>(*t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(const T& t)
{
    std::ostringstream oss;
    oss.imbue(std::locale::classic());
    oss << t;
    return oss.str();
}